

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::Compiler(Compiler *this)

{
  int iVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  int unaff_retaddr;
  Compiler *in_stack_00000008;
  int fail;
  undefined8 in_stack_ffffffffffffffb8;
  int pos;
  undefined4 in_stack_ffffffffffffffc0;
  Walker<re2::Frag> *in_stack_ffffffffffffffd0;
  Prog *this_00;
  
  pos = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  Regexp::Walker<re2::Frag>::Walker(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Compiler_00911d38;
  this_00 = (Prog *)(in_RDI + 6);
  PODArray<re2::Prog::Inst>::PODArray((PODArray<re2::Prog::Inst> *)0x235775);
  std::
  unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  ::unordered_map((unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                   *)0x23578a);
  Frag::Frag((Frag *)(in_RDI + 0x11));
  pvVar2 = operator_new(0x1a0);
  Prog::Prog(this_00);
  in_RDI[3] = pvVar2;
  *(undefined1 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 1;
  *(undefined1 *)(in_RDI + 5) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 1;
  in_RDI[9] = 0;
  iVar1 = AllocInst(in_stack_00000008,unaff_retaddr);
  PODArray<re2::Prog::Inst>::operator[]
            ((PODArray<re2::Prog::Inst> *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),pos);
  Prog::Inst::InitFail((Inst *)0x235826);
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  return;
}

Assistant:

Compiler::Compiler() {
  prog_ = new Prog();
  failed_ = false;
  encoding_ = kEncodingUTF8;
  reversed_ = false;
  ninst_ = 0;
  max_ninst_ = 1;  // make AllocInst for fail instruction okay
  max_mem_ = 0;
  int fail = AllocInst(1);
  inst_[fail].InitFail();
  max_ninst_ = 0;  // Caller must change
}